

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall level_tools::paint_automatic(level_tools *this,xr_surface *surface,uint16_t flags)

{
  char *lname;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  lname = (surface->m_gamemtl)._M_dataplus._M_p;
  bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,"collider_presets",lname);
  if (!bVar1) {
    xray_re::msg("no invisible collider preset for game material %s",lname);
    std::__cxx11::string::assign((char *)&surface->m_texture);
    std::__cxx11::string::assign((char *)&surface->m_eshader);
    return;
  }
  pcVar2 = xray_re::xr_ini_file::r_string(this->m_ini,"collider_presets",lname);
  pcVar3 = scan_value(pcVar2);
  if (pcVar3 != pcVar2) {
    std::__cxx11::string::assign((char *)&surface->m_texture,(ulong)pcVar2);
    pcVar2 = skip_comma(pcVar3);
    if (pcVar2 != (char *)0x0) {
      pcVar3 = scan_value(pcVar2);
      if (pcVar3 != pcVar2) {
        std::__cxx11::string::assign((char *)&surface->m_eshader,(ulong)pcVar2);
        pcVar2 = skip_comma(pcVar3);
        if (pcVar2 != (char *)0x0) {
          pcVar3 = scan_value(pcVar2);
          if (pcVar3 != pcVar2) {
            std::__cxx11::string::assign((char *)&surface->m_cshader,(ulong)pcVar2);
            xray_re::msg("%s -> %s, %s, %s",lname,(surface->m_texture)._M_dataplus._M_p,
                         (surface->m_eshader)._M_dataplus._M_p,(surface->m_cshader)._M_dataplus._M_p
                        );
            return;
          }
        }
      }
    }
    return;
  }
  __assert_fail("p != preset",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                ,0x399,"void level_tools::paint_automatic(xr_surface *, uint16_t) const");
}

Assistant:

void level_tools::paint_automatic(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("collider_presets", gamemtl)) {
		const char* preset = m_ini->r_string("collider_presets", gamemtl);

		const char* p = scan_value(preset);
		xr_assert(p != preset);
		surface->texture().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->eshader().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->cshader().assign(preset, p - preset);

		msg("%s -> %s, %s, %s", gamemtl,
				surface->texture().c_str(), surface->eshader().c_str(),
				surface->cshader().c_str());
	} else {
		msg("no invisible collider preset for game material %s", gamemtl);
		surface->texture() = "prop\\prop_fake_kollision";
		surface->eshader() = "def_shaders\\def_vertex";
	}
}